

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetCFBundleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,bool contentOnly)

{
  bool bVar1;
  char *pcVar2;
  allocator local_81;
  string local_80;
  char *local_60;
  char *ext;
  string local_48;
  undefined1 local_22;
  byte local_21;
  string *psStack_20;
  bool contentOnly_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_22 = 0;
  local_21 = contentOnly;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  GetOutputName(&local_48,this,psStack_20,false);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"BUNDLE_EXTENSION",&local_81);
  pcVar2 = GetProperty(this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_60 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    bVar1 = IsXCTestOnApple(this);
    if (bVar1) {
      local_60 = "xctest";
    }
    else {
      local_60 = "bundle";
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_60);
  bVar1 = cmMakefile::PlatformIsAppleIos(this->Makefile);
  if ((!bVar1) &&
     (std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/Contents"),
     (local_21 & 1) == 0)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/MacOS");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCFBundleDirectory(const std::string& config,
                                                    bool contentOnly) const
{
  std::string fpath;
  fpath += this->GetOutputName(config, false);
  fpath += ".";
  const char *ext = this->GetProperty("BUNDLE_EXTENSION");
  if (!ext)
    {
    if (this->IsXCTestOnApple())
      {
      ext = "xctest";
      }
    else
      {
      ext = "bundle";
      }
    }
  fpath += ext;
  if(!this->Makefile->PlatformIsAppleIos())
  {
    fpath += "/Contents";
    if(!contentOnly)
      fpath += "/MacOS";
  }
  return fpath;
}